

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  int iVar1;
  int extraout_EAX;
  xmlNodePtr *ppxVar2;
  xmlNodePtr *extraout_RAX;
  int iVar3;
  
  iVar1 = ctxt->nodeMax;
  if (iVar1 < 1) {
    ctxt->nodeMax = 4;
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x20);
    ctxt->nodeTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"malloc failed");
      ctxt->nodeMax = 0;
      ppxVar2 = extraout_RAX;
      goto LAB_00193de5;
    }
    iVar1 = ctxt->nodeMax;
  }
  iVar3 = ctxt->nodeNr;
  if (iVar3 < iVar1) {
    ppxVar2 = ctxt->nodeTab;
  }
  else {
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)(iVar1 * 2) << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"realloc failed");
      return extraout_EAX;
    }
    ctxt->nodeMax = ctxt->nodeMax << 1;
    ctxt->nodeTab = ppxVar2;
    iVar3 = ctxt->nodeNr;
  }
  ppxVar2[iVar3] = value;
  ctxt->node = value;
  ctxt->nodeNr = iVar3 + 1;
LAB_00193de5:
  return (int)ppxVar2;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeMax <= 0) {
        ctxt->nodeMax = 4;
        ctxt->nodeTab =
            (xmlNodePtr *) xmlMalloc(ctxt->nodeMax *
                                     sizeof(ctxt->nodeTab[0]));
        if (ctxt->nodeTab == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
            ctxt->nodeMax = 0;
            return (0);
        }
    }
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        tmp = (xmlNodePtr *) xmlRealloc(ctxt->nodeTab,
			      ctxt->nodeMax * 2 * sizeof(ctxt->nodeTab[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt, "realloc failed");
            return (0);
        }
        ctxt->nodeMax *= 2;
	ctxt->nodeTab = tmp;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}